

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.c
# Opt level: O0

void exit_curses_ui(void)

{
  cleanup_sidebar('\x01');
  curs_set(orig_cursor);
  endwin();
  delscreen(curses_scr);
  basewin = (WINDOW_conflict *)0x0;
  write(1,"\x1b[?25h",6);
  return;
}

Assistant:

void exit_curses_ui(void)
{
    cleanup_sidebar(TRUE);
    curs_set(orig_cursor);
    endwin();
    delscreen(curses_scr);
    basewin = NULL;

#ifdef UNIX
    /* Force the cursor to be visible.  In theory, the curs_set() call above
     * should do that.  In practice, something about the game running in
     * dgamelaunch prevents this from happening properly. */
    write(1, "\033[?25h", 6);
#endif
}